

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void dynamic_suite::test_number(void)

{
  bool v;
  undefined8 local_1f8;
  type_conflict9 local_1f0 [3];
  char *msg;
  undefined1 local_1c8 [8];
  variable value;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  undefined1 local_180 [8];
  iarchive in;
  char input [4];
  
  in.member.reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x302e33;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,
             (char *)((long)&in.member.reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl + 0x14));
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            ((basic_iarchive<char> *)local_180,&local_190);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  boost::archive::detail::interface_iarchive<trial::protocol::json::basic_iarchive<char>>::
  operator>>((interface_iarchive<trial::protocol::json::basic_iarchive<char>> *)local_180,
             (basic_variable<std::allocator<char>_> *)local_1c8);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                ((basic_variable<std::allocator<char>_> *)local_1c8);
  boost::detail::test_impl
            ("value.is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2c8,"void dynamic_suite::test_number()",v);
  local_1f0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                           ((basic_variable<std::allocator<char>_> *)local_1c8);
  local_1f8 = 0x4008000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("value.value<double>()","3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2c9,"void dynamic_suite::test_number()",local_1f0,&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive((basic_iarchive<char> *)local_180);
  return;
}

Assistant:

void test_number()
{
    const char input[] = "3.0";
    json::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value.is<real>());
    TRIAL_PROTOCOL_TEST_EQUAL(value.value<double>(), 3.0);
}